

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O3

void __thiscall mjs::function_object::fixup(function_object *this)

{
  gc_heap *this_00;
  
  this_00 = (this->super_native_object).super_object.heap_;
  if (*(int *)&(this->super_native_object).field_0x24 != 0) {
    gc_heap::register_fixup(this_00,(uint32_t *)&(this->super_native_object).field_0x24);
  }
  if ((this->construct_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->construct_).pos_);
  }
  if ((this->call_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->call_).pos_);
  }
  if ((this->text_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->text_).pos_);
  }
  value_representation::fixup(&this->prototype_prop_,this_00);
  native_object::fixup(&this->super_native_object);
  return;
}

Assistant:

void function_object::fixup() {
    auto& h = heap();
    global_.fixup(h);
    construct_.fixup(h);
    call_.fixup(h);
    text_.fixup(h);
    prototype_prop_.fixup(h);
    native_object::fixup();
}